

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O1

bool SetPropertyCommand::HandleAndValidateSourceFilePropertyGENERATED
               (cmSourceFile *sf,string *propertyValue,PropertyOp op)

{
  cmMakefile *this;
  bool bVar1;
  PolicyStatus PVar2;
  cmSourceFileLocation *pcVar3;
  PolicyID id;
  PolicyID id_00;
  PolicyID extraout_EDX;
  PolicyID extraout_EDX_00;
  PolicyID extraout_EDX_01;
  PolicyID id_01;
  char *extraout_RDX;
  string_view value;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string_view value_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  string_view value_04;
  string local_b0;
  undefined1 local_90 [32];
  size_type local_70;
  pointer local_68;
  undefined8 local_60;
  char *local_58;
  string local_50;
  
  pcVar3 = cmSourceFile::GetLocation(sf);
  this = pcVar3->Makefile;
  PVar2 = cmMakefile::GetPolicyStatus(this,CMP0118,false);
  if (PVar2 == WARN) {
    value._M_str = extraout_RDX;
    value._M_len = (size_t)(propertyValue->_M_dataplus)._M_p;
    bVar1 = cmValue::IsOn((cmValue *)propertyValue->_M_string_length,value);
    if ((!bVar1) &&
       (value_01._M_str = (propertyValue->_M_dataplus)._M_p,
       value_01._M_len = propertyValue->_M_string_length, bVar1 = cmValue::IsOff(value_01), !bVar1))
    {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_50,(cmPolicies *)0x76,id);
      local_90._0_8_ = local_50._M_string_length;
      local_90._8_8_ = local_50._M_dataplus._M_p;
      local_90._16_8_ = 0x6e;
      local_90._24_8_ =
           "\nAttempt to set property \'GENERATED\' with the following non-boolean value (which will be interpreted as \"0\"):\n"
      ;
      local_68 = (propertyValue->_M_dataplus)._M_p;
      local_70 = propertyValue->_M_string_length;
      local_60 = 0x80;
      local_58 = 
      "\nThat exact value will not be retrievable. A value of \"0\" will be returned instead.\nThis will be an error under policy CMP0118.\n"
      ;
      views._M_len = 4;
      views._M_array = (iterator)local_90;
      cmCatViews_abi_cxx11_(&local_b0,views);
      cmMakefile::IssueMessage(this,AUTHOR_WARNING,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    value_02._M_str = (propertyValue->_M_dataplus)._M_p;
    value_02._M_len = propertyValue->_M_string_length;
    bVar1 = cmValue::IsOff(value_02);
    id_01 = id_00;
    if (bVar1) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_50,(cmPolicies *)0x76,id_00);
      local_90._0_8_ = local_50._M_string_length;
      local_90._8_8_ = local_50._M_dataplus._M_p;
      local_90._16_8_ = 0x4a;
      local_90._24_8_ =
           "\nUnsetting property \'GENERATED\' will not be allowed under policy CMP0118!\n";
      views_00._M_len = 2;
      views_00._M_array = (iterator)local_90;
      cmCatViews_abi_cxx11_(&local_b0,views_00);
      cmMakefile::IssueMessage(this,AUTHOR_WARNING,&local_b0);
      id_01 = extraout_EDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        id_01 = extraout_EDX_00;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        id_01 = extraout_EDX_01;
      }
    }
    if ((op & ~Set) == Append) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_50,(cmPolicies *)0x76,id_01);
      local_90._0_8_ = local_50._M_string_length;
      local_90._8_8_ = local_50._M_dataplus._M_p;
      local_90._16_8_ = 0x4d;
      local_90._24_8_ =
           "\nAppending to property \'GENERATED\' will not be allowed under policy CMP0118!\n";
      views_01._M_len = 2;
      views_01._M_array = (iterator)local_90;
      cmCatViews_abi_cxx11_(&local_b0,views_01);
      cmMakefile::IssueMessage(this,AUTHOR_WARNING,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
LAB_002bf50d:
    if (WARN < PVar2) {
      cmSourceFile::MarkAsGenerated(sf);
      return true;
    }
LAB_002bf520:
    switch(op) {
    case Remove:
      local_90._0_8_ = local_90 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"GENERATED","");
      cmSourceFile::SetProperty(sf,(string *)local_90,(char *)0x0);
      goto LAB_002bf56b;
    case Set:
      local_90._0_8_ = local_90 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"GENERATED","");
      cmSourceFile::SetProperty(sf,(string *)local_90,(cmValue)propertyValue);
      break;
    case Append:
      local_90._0_8_ = local_90 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"GENERATED","");
      cmSourceFile::AppendProperty(sf,(string *)local_90,propertyValue,false);
      break;
    case AppendAsString:
      local_90._0_8_ = local_90 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"GENERATED","");
      cmSourceFile::AppendProperty(sf,(string *)local_90,propertyValue,true);
      break;
    default:
      return true;
    }
    local_b0.field_2._M_allocated_capacity = local_90._16_8_;
    local_b0._M_dataplus._M_p = (pointer)local_90._0_8_;
    if ((undefined1 *)local_90._0_8_ == local_90 + 0x10) {
      return true;
    }
  }
  else {
    if (PVar2 < NEW) goto LAB_002bf520;
    value_00._M_str = extraout_RDX;
    value_00._M_len = (size_t)(propertyValue->_M_dataplus)._M_p;
    bVar1 = cmValue::IsOn((cmValue *)propertyValue->_M_string_length,value_00);
    if ((!bVar1) &&
       (value_03._M_str = (propertyValue->_M_dataplus)._M_p,
       value_03._M_len = propertyValue->_M_string_length, bVar1 = cmValue::IsOff(value_03), !bVar1))
    {
      local_90._24_8_ = (propertyValue->_M_dataplus)._M_p;
      local_90._16_8_ = propertyValue->_M_string_length;
      local_90._0_8_ = (pointer)0x7a;
      local_90._8_8_ =
           "Policy CMP0118 is set to NEW and the following non-boolean value given for property \'GENERATED\' is therefore not allowed:\n"
      ;
      local_70 = 0x22;
      local_68 = "\nReplace it with a boolean value!\n";
      views_02._M_len = 3;
      views_02._M_array = (iterator)local_90;
      cmCatViews_abi_cxx11_(&local_b0,views_02);
      cmMakefile::IssueMessage(this,AUTHOR_ERROR,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
        return true;
      }
      goto LAB_002bf62b;
    }
    value_04._M_str = (propertyValue->_M_dataplus)._M_p;
    value_04._M_len = propertyValue->_M_string_length;
    bVar1 = cmValue::IsOff(value_04);
    if (bVar1) {
      local_90._0_8_ = local_90 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_90,
                 "Unsetting the \'GENERATED\' property is not allowed under CMP0118!\n","");
      cmMakefile::IssueMessage(this,AUTHOR_ERROR,(string *)local_90);
    }
    else {
      if ((op & ~Set) != Append) goto LAB_002bf50d;
      local_90._0_8_ = local_90 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_90,
                 "Policy CMP0118 is set to NEW and appending to the \'GENERATED\' property is therefore not allowed. Only setting it to \"1\" is allowed!\n"
                 ,"");
      cmMakefile::IssueMessage(this,AUTHOR_ERROR,(string *)local_90);
    }
LAB_002bf56b:
    local_b0.field_2._M_allocated_capacity = local_90._16_8_;
    local_b0._M_dataplus._M_p = (pointer)local_90._0_8_;
    if ((undefined1 *)local_90._0_8_ == local_90 + 0x10) {
      return true;
    }
  }
LAB_002bf62b:
  operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  return true;
}

Assistant:

bool HandleAndValidateSourceFilePropertyGENERATED(
  cmSourceFile* sf, std::string const& propertyValue, PropertyOp op)
{
  const auto& mf = *sf->GetLocation().GetMakefile();
  auto policyStatus = mf.GetPolicyStatus(cmPolicies::CMP0118);

  const bool policyWARN = policyStatus == cmPolicies::WARN;
  const bool policyNEW = policyStatus != cmPolicies::OLD && !policyWARN;

  if (policyWARN) {
    if (!cmIsOn(propertyValue) && !cmIsOff(propertyValue)) {
      mf.IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0118),
                 "\nAttempt to set property 'GENERATED' with the following "
                 "non-boolean value (which will be interpreted as \"0\"):\n",
                 propertyValue,
                 "\nThat exact value will not be retrievable. A value of "
                 "\"0\" will be returned instead.\n"
                 "This will be an error under policy CMP0118.\n"));
    }
    if (cmIsOff(propertyValue)) {
      mf.IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0118),
                 "\nUnsetting property 'GENERATED' will not be allowed under "
                 "policy CMP0118!\n"));
    }
    if (op == PropertyOp::Append || op == PropertyOp::AppendAsString) {
      mf.IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0118),
                 "\nAppending to property 'GENERATED' will not be allowed "
                 "under policy CMP0118!\n"));
    }
  } else if (policyNEW) {
    if (!cmIsOn(propertyValue) && !cmIsOff(propertyValue)) {
      mf.IssueMessage(
        MessageType::AUTHOR_ERROR,
        cmStrCat(
          "Policy CMP0118 is set to NEW and the following non-boolean value "
          "given for property 'GENERATED' is therefore not allowed:\n",
          propertyValue, "\nReplace it with a boolean value!\n"));
      return true;
    }
    if (cmIsOff(propertyValue)) {
      mf.IssueMessage(
        MessageType::AUTHOR_ERROR,
        "Unsetting the 'GENERATED' property is not allowed under CMP0118!\n");
      return true;
    }
    if (op == PropertyOp::Append || op == PropertyOp::AppendAsString) {
      mf.IssueMessage(MessageType::AUTHOR_ERROR,
                      "Policy CMP0118 is set to NEW and appending to the "
                      "'GENERATED' property is therefore not allowed. Only "
                      "setting it to \"1\" is allowed!\n");
      return true;
    }
  }

  // Set property.
  if (!policyNEW) {
    // Do it the traditional way.
    switch (op) {
      case PropertyOp::Append:
        sf->AppendProperty("GENERATED", propertyValue, false);
        break;
      case PropertyOp::AppendAsString:
        sf->AppendProperty("GENERATED", propertyValue, true);
        break;
      case PropertyOp::Remove:
        sf->SetProperty("GENERATED", nullptr);
        break;
      case PropertyOp::Set:
        sf->SetProperty("GENERATED", propertyValue);
        break;
    }
  } else {
    sf->MarkAsGenerated();
  }
  return true;
}